

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_imit_final(EVP_MD_CTX *ctx,uchar *md)

{
  byte *in_RSI;
  void *in_RDI;
  int i;
  uchar buffer [8];
  ossl_gost_imit_ctx *c;
  uchar *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined1 local_28 [8];
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  local_20 = EVP_MD_CTX_get0_md_data(in_RDI);
  if (*(int *)(local_20 + 0x107c) == 0) {
    ERR_GOST_error(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                   (char *)in_stack_ffffffffffffffc8,0);
    iVar1 = 0;
  }
  else {
    if ((*(int *)(local_20 + 0x1070) == 0) && (*(int *)(local_20 + 0x1078) != 0)) {
      memset(local_28,0,8);
      gost_imit_update((EVP_MD_CTX *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(size_t)in_RSI);
    }
    if (*(int *)(local_20 + 0x1078) != 0) {
      for (iVar1 = *(int *)(local_20 + 0x1078); iVar1 < 8; iVar1 = iVar1 + 1) {
        *(undefined1 *)(local_20 + 0x1068 + (long)iVar1) = 0;
      }
      mac_block_mesh((ossl_gost_imit_ctx *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
    }
    get_mac((byte *)(local_20 + 0x1060),*(int *)(local_20 + 0x1080) << 3,in_RSI);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int gost_imit_final(EVP_MD_CTX *ctx, unsigned char *md)
{
    struct ossl_gost_imit_ctx *c = EVP_MD_CTX_md_data(ctx);
    if (!c->key_set) {
        GOSTerr(GOST_F_GOST_IMIT_FINAL, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }
    if (c->count == 0 && c->bytes_left) {
        unsigned char buffer[8];
        memset(buffer, 0, 8);
        gost_imit_update(ctx, buffer, 8);
    }
    if (c->bytes_left) {
        int i;
        for (i = c->bytes_left; i < 8; i++) {
            c->partial_block[i] = 0;
        }
        mac_block_mesh(c, c->partial_block);
    }
    get_mac(c->buffer, 8 * c->dgst_size, md);
    return 1;
}